

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderCase.cpp
# Opt level: O1

void deqp::egl::getDefaultRenderFilterLists
               (vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>
                *filterLists,FilterList *baseFilters)

{
  EGLint EVar1;
  long *plVar2;
  FilterList *pFVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  RenderFilterList filters;
  string name;
  allocator<char> local_f9;
  vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_> *local_f8;
  FilterList *local_f0;
  value_type local_e8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long local_68;
  anon_struct_16_2_3c8bed26 *local_60;
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  lVar4 = 0;
  local_f8 = filterLists;
  local_f0 = baseFilters;
  do {
    local_60 = getDefaultRenderFilterLists::s_colorRules + lVar4;
    local_58 = getDefaultRenderFilterLists::s_colorRules[lVar4].name;
    lVar6 = 0x10;
    local_68 = lVar4;
    do {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,local_58,&local_f9);
      plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
      plVar5 = plVar2 + 2;
      if ((pointer *)*plVar2 == (pointer *)plVar5) {
        local_e8.super_NamedFilterList.super_FilterList.m_rules.
        super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar5;
        local_e8.super_NamedFilterList.m_name._M_dataplus._M_p = (pointer)plVar2[3];
        local_e8.super_NamedFilterList.super_FilterList.m_rules.
        super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((long)&local_e8.super_NamedFilterList.super_FilterList.m_rules.
                              super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                              ._M_impl + 0x10);
      }
      else {
        local_e8.super_NamedFilterList.super_FilterList.m_rules.
        super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar5;
        local_e8.super_NamedFilterList.super_FilterList.m_rules.
        super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar2;
      }
      local_e8.super_NamedFilterList.super_FilterList.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar2[1];
      *plVar2 = (long)plVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_e8);
      plVar5 = plVar2 + 2;
      if ((long *)*plVar2 == plVar5) {
        local_78 = *plVar5;
        lStack_70 = plVar2[3];
        local_88 = &local_78;
      }
      else {
        local_78 = *plVar5;
        local_88 = (long *)*plVar2;
      }
      local_80 = plVar2[1];
      *plVar2 = (long)plVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if ((pointer *)
          local_e8.super_NamedFilterList.super_FilterList.m_rules.
          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer *)
          ((long)&local_e8.super_NamedFilterList.super_FilterList.m_rules.
                  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                  ._M_impl + 0x10U)) {
        operator_delete(local_e8.super_NamedFilterList.super_FilterList.m_rules.
                        super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.super_NamedFilterList.super_FilterList.m_rules.
                              super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      EVar1 = *(EGLint *)((long)&getDefaultRenderFilterLists::s_colorRules[4].filter + lVar6);
      NamedFilterList::NamedFilterList
                (&local_e8.super_NamedFilterList,(char *)local_88,
                 glcts::fixed_sample_locations_values + 1);
      local_e8.m_surfaceTypeMask = EVar1;
      pFVar3 = eglu::FilterList::operator<<((FilterList *)&local_e8,local_f0);
      pFVar3 = eglu::FilterList::operator<<(pFVar3,local_60->filter);
      pFVar3 = eglu::FilterList::operator<<
                         (pFVar3,*(ConfigFilter *)
                                  ((long)&getDefaultRenderFilterLists::s_surfaceRules[0].name +
                                  lVar6));
      eglu::FilterList::operator<<(pFVar3,isConformant);
      std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>::
      push_back(local_f8,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.super_NamedFilterList.m_description._M_dataplus._M_p !=
          &local_e8.super_NamedFilterList.m_description.field_2) {
        operator_delete(local_e8.super_NamedFilterList.m_description._M_dataplus._M_p,
                        local_e8.super_NamedFilterList.m_description.field_2._M_allocated_capacity +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.super_NamedFilterList.m_name._M_dataplus._M_p !=
          &local_e8.super_NamedFilterList.m_name.field_2) {
        operator_delete(local_e8.super_NamedFilterList.m_name._M_dataplus._M_p,
                        local_e8.super_NamedFilterList.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((pointer *)
          local_e8.super_NamedFilterList.super_FilterList.m_rules.
          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
        operator_delete(local_e8.super_NamedFilterList.super_FilterList.m_rules.
                        super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.super_NamedFilterList.super_FilterList.m_rules.
                              super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.super_NamedFilterList.super_FilterList.m_rules.
                              super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_88 != &local_78) {
        operator_delete(local_88,local_78 + 1);
      }
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x58);
    lVar4 = local_68 + 1;
  } while (lVar4 != 5);
  NamedFilterList::NamedFilterList
            (&local_e8.super_NamedFilterList,"other",glcts::fixed_sample_locations_values + 1);
  local_e8.m_surfaceTypeMask = 7;
  pFVar3 = eglu::FilterList::operator<<((FilterList *)&local_e8,local_f0);
  pFVar3 = eglu::FilterList::operator<<(pFVar3,notColorBits<5,6,5,0>);
  pFVar3 = eglu::FilterList::operator<<(pFVar3,notColorBits<8,8,8,0>);
  pFVar3 = eglu::FilterList::operator<<(pFVar3,notColorBits<4,4,4,4>);
  pFVar3 = eglu::FilterList::operator<<(pFVar3,notColorBits<5,5,5,1>);
  pFVar3 = eglu::FilterList::operator<<(pFVar3,notColorBits<8,8,8,8>);
  pFVar3 = eglu::FilterList::operator<<(pFVar3,isConformant);
  eglu::FilterList::operator<<(pFVar3,notFloat);
  std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>::push_back
            (local_f8,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.super_NamedFilterList.m_description._M_dataplus._M_p !=
      &local_e8.super_NamedFilterList.m_description.field_2) {
    operator_delete(local_e8.super_NamedFilterList.m_description._M_dataplus._M_p,
                    local_e8.super_NamedFilterList.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.super_NamedFilterList.m_name._M_dataplus._M_p !=
      &local_e8.super_NamedFilterList.m_name.field_2) {
    operator_delete(local_e8.super_NamedFilterList.m_name._M_dataplus._M_p,
                    local_e8.super_NamedFilterList.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((pointer *)
      local_e8.super_NamedFilterList.super_FilterList.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_e8.super_NamedFilterList.super_FilterList.m_rules.
                    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.super_NamedFilterList.super_FilterList.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super_NamedFilterList.super_FilterList.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void getDefaultRenderFilterLists (vector<RenderFilterList>& filterLists, const eglu::FilterList& baseFilters)
{
	static const struct
	{
		const char*			name;
		eglu::ConfigFilter	filter;
	} s_colorRules[] =
	{
		{ "rgb565",		colorBits<5, 6, 5, 0>	},
		{ "rgb888",		colorBits<8, 8, 8, 0>	},
		{ "rgba4444",	colorBits<4, 4, 4, 4>	},
		{ "rgba5551",	colorBits<5, 5, 5, 1>	},
		{ "rgba8888",	colorBits<8, 8, 8, 8>	},
	};

	static const struct
	{
		const char*			name;
		EGLint				bits;
		eglu::ConfigFilter	filter;
	} s_surfaceRules[] =
	{
		{ "window",		EGL_WINDOW_BIT,		surfaceType<EGL_WINDOW_BIT>		},
		{ "pixmap",		EGL_PIXMAP_BIT,		surfaceType<EGL_PIXMAP_BIT>,	},
		{ "pbuffer",	EGL_PBUFFER_BIT,	surfaceType<EGL_PBUFFER_BIT>	}
	};

	for (int colorNdx = 0; colorNdx < DE_LENGTH_OF_ARRAY(s_colorRules); colorNdx++)
	{
		for (int surfaceNdx = 0; surfaceNdx < DE_LENGTH_OF_ARRAY(s_surfaceRules); surfaceNdx++)
		{
			const string		name	= string(s_colorRules[colorNdx].name) + "_" + s_surfaceRules[surfaceNdx].name;
			RenderFilterList	filters	(name.c_str(), "", s_surfaceRules[surfaceNdx].bits);

			filters << baseFilters
					<< s_colorRules[colorNdx].filter
					<< s_surfaceRules[surfaceNdx].filter
					<< isConformant;

			filterLists.push_back(filters);
		}
	}

	// Add other config ids to "other" set
	{
		RenderFilterList	filters	("other", "", EGL_WINDOW_BIT|EGL_PIXMAP_BIT|EGL_PBUFFER_BIT);

		filters << baseFilters
				<< notColorBits<5, 6, 5, 0>
				<< notColorBits<8, 8, 8, 0>
				<< notColorBits<4, 4, 4, 4>
				<< notColorBits<5, 5, 5, 1>
				<< notColorBits<8, 8, 8, 8>
				<< isConformant
				<< notFloat;

		filterLists.push_back(filters);
	}
}